

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void wabt::WriteLimits(Stream *stream,Limits *limits)

{
  WriteU32Leb128(stream,(uint)limits->has_max + (uint)limits->is_shared * 2 +
                        (uint)limits->is_64 * 4,"limits: flags");
  WriteU32Leb128(stream,(uint32_t)limits->initial,"limits: initial");
  if (limits->has_max == true) {
    WriteU32Leb128(stream,(uint32_t)limits->max,"limits: max");
    return;
  }
  return;
}

Assistant:

void WriteLimits(Stream* stream, const Limits* limits) {
  uint32_t flags = limits->has_max ? WABT_BINARY_LIMITS_HAS_MAX_FLAG : 0;
  flags |= limits->is_shared ? WABT_BINARY_LIMITS_IS_SHARED_FLAG : 0;
  flags |= limits->is_64 ? WABT_BINARY_LIMITS_IS_64_FLAG : 0;
  WriteU32Leb128(stream, flags, "limits: flags");
  WriteU32Leb128(stream, limits->initial, "limits: initial");
  if (limits->has_max) {
    WriteU32Leb128(stream, limits->max, "limits: max");
  }
}